

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict par_type_name(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  int iVar2;
  char *pcVar3;
  node_t_conflict r;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    if (ppVar1->record_level == 0) {
      pcVar3 = get_token_name(c2m_ctx,0x28);
      syntax_error(c2m_ctx,pcVar3);
    }
    c2m_ctx_local = (c2m_ctx_t)&err_struct;
  }
  else {
    c2m_ctx_local = (c2m_ctx_t)type_name(c2m_ctx,no_err_p);
    if ((c2m_ctx_local != (c2m_ctx_t)&err_struct) &&
       (iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0),
       iVar2 == 0)) {
      if (ppVar1->record_level == 0) {
        pcVar3 = get_token_name(c2m_ctx,0x29);
        syntax_error(c2m_ctx,pcVar3);
      }
      c2m_ctx_local = (c2m_ctx_t)&err_struct;
    }
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

D (par_type_name) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r;

  PT ('(');
  P (type_name);
  PT (')');
  return r;
}